

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property_attribute.h
# Opt level: O0

bool mjs::has_attributes(property_attribute attributes,property_attribute check)

{
  bool bVar1;
  property_attribute pVar2;
  bool bVar3;
  property_attribute check_local;
  property_attribute attributes_local;
  
  bVar1 = is_valid(attributes);
  bVar3 = false;
  if (bVar1) {
    bVar1 = is_valid(check);
    bVar3 = false;
    if (bVar1) {
      bVar3 = check != none;
    }
  }
  if (bVar3) {
    pVar2 = operator&(attributes,check);
    return pVar2 == check;
  }
  __assert_fail("is_valid(attributes) && is_valid(check) && check != property_attribute::none",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                ,0x2e,"bool mjs::has_attributes(property_attribute, property_attribute)");
}

Assistant:

constexpr bool has_attributes(property_attribute attributes, property_attribute check) {
    assert(is_valid(attributes) && is_valid(check) && check != property_attribute::none);
    return (attributes & check) == check;
}